

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_glib.cpp
# Opt level: O1

void __thiscall
QEventDispatcherGlibPrivate::QEventDispatcherGlibPrivate
          (QEventDispatcherGlibPrivate *this,GMainContext *context)

{
  QCoreApplication *this_00;
  QThread *pQVar1;
  QThread *pQVar2;
  GMainContext *pGVar3;
  GPostEventSource *pGVar4;
  GSocketNotifierSource *pGVar5;
  GTimerSource *pGVar6;
  GIdleTimerSource *pGVar7;
  
  QAbstractEventDispatcherPrivate::QAbstractEventDispatcherPrivate
            (&this->super_QAbstractEventDispatcherPrivate);
  (this->super_QAbstractEventDispatcherPrivate).super_QObjectPrivate.super_QObjectData.
  _vptr_QObjectData = (_func_int **)&PTR__QEventDispatcherGlibPrivate_006b3df8;
  this->mainContext = context;
  this->wakeUpCalled = true;
  this_00 = QCoreApplication::self;
  if (context == (GMainContext *)0x0) {
    if (QCoreApplication::self != (QCoreApplication *)0x0) {
      pQVar1 = QThread::currentThread();
      pQVar2 = QObject::thread(&this_00->super_QObject);
      if (pQVar1 == pQVar2) {
        pGVar3 = (GMainContext *)g_main_context_default();
        this->mainContext = pGVar3;
        g_main_context_ref(pGVar3);
        goto LAB_004a873d;
      }
    }
    pGVar3 = (GMainContext *)g_main_context_new();
    this->mainContext = pGVar3;
  }
  else {
    g_main_context_ref(context);
  }
LAB_004a873d:
  g_main_context_push_thread_default(this->mainContext);
  pGVar4 = (GPostEventSource *)g_source_new(&postEventSourceFuncs,0x70);
  g_source_set_name(pGVar4,"[Qt] GPostEventSource");
  this->postEventSource = pGVar4;
  (pGVar4->serialNumber).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pGVar4 = this->postEventSource;
  pGVar4->d = this;
  g_source_set_can_recurse(pGVar4,1);
  g_source_attach(this->postEventSource,this->mainContext);
  pGVar5 = (GSocketNotifierSource *)g_source_new(&socketNotifierSourceFuncs,0x80);
  g_source_set_name(pGVar5,"[Qt] GSocketNotifierSource");
  this->socketNotifierSource = pGVar5;
  (pGVar5->pollfds).d.d = (Data *)0x0;
  (pGVar5->pollfds).d.ptr = (GPollFDWithQSocketNotifier **)0x0;
  (pGVar5->pollfds).d.size = 0;
  g_source_set_can_recurse(this->socketNotifierSource,1);
  g_source_attach(this->socketNotifierSource,this->mainContext);
  pGVar6 = (GTimerSource *)g_source_new(&timerSourceFuncs,0x90);
  g_source_set_name(pGVar6,"[Qt] GTimerSource");
  this->timerSource = pGVar6;
  QTimerInfoList::QTimerInfoList(&pGVar6->timerList);
  (this->timerSource->processEventsFlags).
  super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
  super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i = 0;
  pGVar6 = this->timerSource;
  pGVar6->runWithIdlePriority = false;
  g_source_set_can_recurse(pGVar6,1);
  g_source_attach(this->timerSource,this->mainContext);
  pGVar7 = (GIdleTimerSource *)g_source_new(&idleTimerSourceFuncs,0x68);
  g_source_set_name(pGVar7,"[Qt] GIdleTimerSource");
  this->idleTimerSource = pGVar7;
  pGVar7->timerSource = this->timerSource;
  g_source_set_can_recurse(pGVar7,1);
  g_source_attach(this->idleTimerSource,this->mainContext);
  return;
}

Assistant:

QEventDispatcherGlibPrivate::QEventDispatcherGlibPrivate(GMainContext *context)
    : mainContext(context)
{
#if GLIB_MAJOR_VERSION == 2 && GLIB_MINOR_VERSION < 32
    if (qEnvironmentVariableIsEmpty("QT_NO_THREADED_GLIB")) {
        Q_CONSTINIT static QBasicMutex mutex;
        QMutexLocker locker(&mutex);
        if (!g_thread_supported())
            g_thread_init(NULL);
    }
#endif

    if (mainContext) {
        g_main_context_ref(mainContext);
    } else {
        QCoreApplication *app = QCoreApplication::instance();
        if (app && QThread::currentThread() == app->thread()) {
            mainContext = g_main_context_default();
            g_main_context_ref(mainContext);
        } else {
            mainContext = g_main_context_new();
        }
    }

#if GLIB_CHECK_VERSION (2, 22, 0)
    g_main_context_push_thread_default (mainContext);
#endif

    // setup post event source
    GSource *source = g_source_new(&postEventSourceFuncs, sizeof(GPostEventSource));
    g_source_set_name(source, "[Qt] GPostEventSource");
    postEventSource = reinterpret_cast<GPostEventSource *>(source);

    postEventSource->serialNumber.storeRelaxed(1);
    postEventSource->d = this;
    g_source_set_can_recurse(&postEventSource->source, true);
    g_source_attach(&postEventSource->source, mainContext);

    // setup socketNotifierSource
    source = g_source_new(&socketNotifierSourceFuncs, sizeof(GSocketNotifierSource));
    g_source_set_name(source, "[Qt] GSocketNotifierSource");
    socketNotifierSource = reinterpret_cast<GSocketNotifierSource *>(source);
    (void) new (&socketNotifierSource->pollfds) QList<GPollFDWithQSocketNotifier *>();
    g_source_set_can_recurse(&socketNotifierSource->source, true);
    g_source_attach(&socketNotifierSource->source, mainContext);

    // setup normal and idle timer sources
    source = g_source_new(&timerSourceFuncs, sizeof(GTimerSource));
    g_source_set_name(source, "[Qt] GTimerSource");
    timerSource = reinterpret_cast<GTimerSource *>(source);
    (void) new (&timerSource->timerList) QTimerInfoList();
    timerSource->processEventsFlags = QEventLoop::AllEvents;
    timerSource->runWithIdlePriority = false;
    g_source_set_can_recurse(&timerSource->source, true);
    g_source_attach(&timerSource->source, mainContext);

    source = g_source_new(&idleTimerSourceFuncs, sizeof(GIdleTimerSource));
    g_source_set_name(source, "[Qt] GIdleTimerSource");
    idleTimerSource = reinterpret_cast<GIdleTimerSource *>(source);
    idleTimerSource->timerSource = timerSource;
    g_source_set_can_recurse(&idleTimerSource->source, true);
    g_source_attach(&idleTimerSource->source, mainContext);
}